

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O1

Abc_Cex_t * Bmc_CexCareTotal(Abc_Cex_t **pCexes,int nCexes)

{
  Abc_Cex_t *pAVar1;
  Abc_Cex_t *pAVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  pAVar1 = *pCexes;
  uVar3 = pAVar1->nBits;
  iVar7 = (int)uVar3 >> 5;
  pAVar2 = Abc_CexAlloc(pAVar1->nRegs,pAVar1->nPis,pAVar1->iFrame + 1);
  pAVar1 = *pCexes;
  pAVar2->iPo = pAVar1->iPo;
  pAVar2->iFrame = pAVar1->iFrame;
  uVar5 = (uint)((uVar3 & 0x1f) != 0);
  uVar3 = uVar5 + iVar7;
  if (uVar3 != 0 && SCARRY4(uVar5,iVar7) == (int)uVar3 < 0) {
    uVar4 = 0;
    do {
      (&pAVar2[1].iPo)[uVar4] = (&pAVar1[1].iPo)[uVar4];
      if (1 < nCexes) {
        uVar5 = (&pAVar2[1].iPo)[uVar4];
        uVar6 = 1;
        do {
          uVar5 = uVar5 & (&pCexes[uVar6][1].iPo)[uVar4];
          (&pAVar2[1].iPo)[uVar4] = uVar5;
          uVar6 = uVar6 + 1;
        } while ((uint)nCexes != uVar6);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
  }
  return pAVar2;
}

Assistant:

Abc_Cex_t * Bmc_CexCareTotal( Abc_Cex_t ** pCexes, int nCexes )
{
    int i, k, nWords = Abc_BitWordNum( pCexes[0]->nBits );
    Abc_Cex_t * pCexMin = Abc_CexAlloc( pCexes[0]->nRegs, pCexes[0]->nPis, pCexes[0]->iFrame + 1 );
    pCexMin->iPo    = pCexes[0]->iPo;
    pCexMin->iFrame = pCexes[0]->iFrame;
    for ( i = 0; i < nWords; i++ )
    {
        pCexMin->pData[i] = pCexes[0]->pData[i];
        for ( k = 1; k < nCexes; k++ )
            pCexMin->pData[i] &= pCexes[k]->pData[i];
    }
    return pCexMin;
}